

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O3

boolean mon_reflects(monst *mon,char *str)

{
  ushort uVar1;
  permonst *ppVar2;
  boolean bVar3;
  uint uVar4;
  obj *obj;
  char *pcVar5;
  char *pcVar6;
  int oindx;
  
  obj = which_armor(mon,8);
  if ((obj == (obj *)0x0) || ((obj->otyp != 0x8e && ((obj->oprops & 0x10) == 0)))) {
    obj = mon->mw;
    if ((obj == (obj *)0x0) ||
       ((bVar3 = arti_reflects(obj), bVar3 == '\0' && ((obj->oprops & 0x10) == 0)))) {
      obj = which_armor(mon,0x10000);
      if ((obj != (obj *)0x0) && ((obj->otyp == 0xd0 || ((obj->oprops & 0x10) != 0)))) {
        if (str == (char *)0x0) {
          return '\x01';
        }
        pcVar5 = mon_nam(mon);
        pcVar5 = s_suffix(pcVar5);
        pline(str,pcVar5,"amulet");
        if (obj->otyp == 0xd0) {
          oindx = 0xd0;
          goto LAB_001fe56a;
        }
        goto LAB_001fe579;
      }
      obj = which_armor(mon,2);
      if ((obj == (obj *)0x0) || ((obj->oprops & 0x10) == 0)) {
        obj = which_armor(mon,1);
        if ((obj != (obj *)0x0) &&
           (((uVar4 = (ushort)obj->otyp - 0x55, uVar4 < 0x15 &&
             ((0x100a01U >> (uVar4 & 0x1f) & 1) != 0)) || ((obj->oprops & 0x10) != 0)))) {
          if (str == (char *)0x0) {
            return '\x01';
          }
          pcVar5 = mon_nam(mon);
          pcVar5 = s_suffix(pcVar5);
          pline(str,pcVar5,"armor");
          if ((obj->oprops & 0x10) == 0) {
            uVar1 = obj->otyp;
            if ((uVar1 != 0x60) && (uVar1 != 0x55)) {
              return '\x01';
            }
            discover_object((uint)uVar1,'\x01','\x01');
            return '\x01';
          }
          goto LAB_001fe581;
        }
        obj = which_armor(mon,0x40);
        if ((obj == (obj *)0x0) || ((obj->oprops & 0x10) == 0)) {
          ppVar2 = mon->data;
          if (ppVar2 != mons + 0x179 && (ppVar2 != mons + 0x9d && ppVar2 != mons + 0x94)) {
            return '\0';
          }
          if (str == (char *)0x0) {
            return '\x01';
          }
          pcVar5 = mon_nam(mon);
          pcVar5 = s_suffix(pcVar5);
          pline(str,pcVar5,"scales");
          return '\x01';
        }
        if (str == (char *)0x0) {
          return '\x01';
        }
        pcVar5 = mon_nam(mon);
        pcVar5 = s_suffix(pcVar5);
        pcVar6 = "shirt";
      }
      else {
        if (str == (char *)0x0) {
          return '\x01';
        }
        pcVar5 = mon_nam(mon);
        pcVar5 = s_suffix(pcVar5);
        pcVar6 = "cloak";
      }
    }
    else {
      if (str == (char *)0x0) {
        return '\x01';
      }
      pcVar5 = mon_nam(mon);
      pcVar5 = s_suffix(pcVar5);
      pcVar6 = "weapon";
    }
    pline(str,pcVar5,pcVar6);
  }
  else {
    if (str == (char *)0x0) {
      return '\x01';
    }
    pcVar5 = mon_nam(mon);
    pcVar5 = s_suffix(pcVar5);
    pline(str,pcVar5,"shield");
    if (obj->otyp == 0x8e) {
      oindx = 0x8e;
LAB_001fe56a:
      discover_object(oindx,'\x01','\x01');
    }
  }
LAB_001fe579:
  if ((obj->oprops & 0x10) == 0) {
    return '\x01';
  }
LAB_001fe581:
  *(byte *)&obj->oprops_known = (byte)obj->oprops_known | 0x10;
  return '\x01';
}

Assistant:

boolean mon_reflects(struct monst *mon, const char *str)
{
	struct obj *orefl = which_armor(mon, W_ARMS);

	if (orefl && (orefl->otyp == SHIELD_OF_REFLECTION ||
		      (orefl->oprops & ITEM_REFLECTION))) {
	    if (str) {
		pline(str, s_suffix(mon_nam(mon)), "shield");
		if (orefl->otyp == SHIELD_OF_REFLECTION)
		    makeknown(SHIELD_OF_REFLECTION);
		if (orefl->oprops & ITEM_REFLECTION)
		    orefl->oprops_known |= ITEM_REFLECTION;
	    }
	    return TRUE;

	} else if ((orefl = MON_WEP(mon)) &&
		   (arti_reflects(orefl) ||
		    (orefl->oprops & ITEM_REFLECTION))) {
	    /* due to wielded artifact weapon */
	    if (str) {
		pline(str, s_suffix(mon_nam(mon)), "weapon");
		if (orefl->oprops & ITEM_REFLECTION)
		    orefl->oprops_known |= ITEM_REFLECTION;
	    }
	    return TRUE;

	} else if ((orefl = which_armor(mon, W_AMUL)) &&
		   (orefl->otyp == AMULET_OF_REFLECTION ||
		    (orefl->oprops & ITEM_REFLECTION))) {
	    if (str) {
		pline(str, s_suffix(mon_nam(mon)), "amulet");
		if (orefl->otyp == AMULET_OF_REFLECTION)
		    makeknown(AMULET_OF_REFLECTION);
		if (orefl->oprops & ITEM_REFLECTION)
		    orefl->oprops_known |= ITEM_REFLECTION;
	    }
	    return TRUE;

	} else if ((orefl = which_armor(mon, W_ARMC)) &&
		   (orefl->oprops & ITEM_REFLECTION)) {
	    if (str) {
		pline(str, s_suffix(mon_nam(mon)), "cloak");
		if (orefl->oprops & ITEM_REFLECTION)
		    orefl->oprops_known |= ITEM_REFLECTION;
	    }
	    return TRUE;

	} else if ((orefl = which_armor(mon, W_ARM)) &&
		   (orefl->otyp == SILVER_DRAGON_SCALES ||
		    orefl->otyp == SILVER_DRAGON_SCALE_MAIL ||
		    orefl->otyp == CHROMATIC_DRAGON_SCALES ||
		    orefl->otyp == CHROMATIC_DRAGON_SCALE_MAIL ||
		    (orefl->oprops & ITEM_REFLECTION))) {
	    if (str) {
		pline(str, s_suffix(mon_nam(mon)), "armor");
		if (orefl->oprops & ITEM_REFLECTION) {
		    orefl->oprops_known |= ITEM_REFLECTION;
		} else if (orefl->otyp == SILVER_DRAGON_SCALES ||
			   orefl->otyp == SILVER_DRAGON_SCALE_MAIL) {
		    makeknown(orefl->otyp);
		}
	    }
	    return TRUE;

	} else if ((orefl = which_armor(mon, W_ARMU)) &&
		   (orefl->oprops & ITEM_REFLECTION)) {
	    if (str) {
		pline(str, s_suffix(mon_nam(mon)), "shirt");
		if (orefl->oprops & ITEM_REFLECTION)
		    orefl->oprops_known |= ITEM_REFLECTION;
	    }
	    return TRUE;

	} else if (mon->data == &mons[PM_SILVER_DRAGON] ||
		   mon->data == &mons[PM_CHROMATIC_DRAGON] ||
		   mon->data == &mons[PM_TIAMAT]) {
	    /* Silver dragons only reflect when mature; babies do not */
	    if (str)
		pline(str, s_suffix(mon_nam(mon)), "scales");
	    return TRUE;
	}

	return FALSE;
}